

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_option_version.c
# Opt level: O0

void test_option_version(void)

{
  wchar_t wVar1;
  EVP_PKEY_CTX *ctx;
  char *tbs;
  size_t siglen;
  size_t tbslen;
  size_t s;
  char *p;
  int r;
  char *in_stack_00000498;
  wchar_t in_stack_000004a4;
  char *in_stack_000004a8;
  uchar *in_stack_ffffffffffffffe8;
  char *in_stack_fffffffffffffff0;
  wchar_t in_stack_fffffffffffffff8;
  
  wVar1 = systemf("%s --version >version.stdout 2>version.stderr",testprog);
  if (wVar1 != L'\0') {
    wVar1 = systemf("%s -W version >version.stdout 2>version.stderr",testprog);
  }
  failure("Unable to run either %s --version or %s -W version",testprog,testprog);
  tbs = "r == 0";
  tbslen = 0;
  wVar1 = assertion_assert((char *)s,wVar1,in_stack_fffffffffffffff8,in_stack_fffffffffffffff0,
                           in_stack_ffffffffffffffe8);
  if (wVar1 != L'\0') {
    assertion_empty_file(in_stack_000004a8,in_stack_000004a4,in_stack_00000498);
    ctx = (EVP_PKEY_CTX *)slurpfile((size_t *)&stack0xffffffffffffffe8,"version.stdout");
    verify(ctx,in_stack_ffffffffffffffe8,siglen,(uchar *)tbs,tbslen);
    free(ctx);
  }
  return;
}

Assistant:

DEFINE_TEST(test_option_version)
{
	int r;
	char *p;
	size_t s;

	r = systemf("%s --version >version.stdout 2>version.stderr", testprog);
	if (r != 0)
		r = systemf("%s -W version >version.stdout 2>version.stderr",
		    testprog);
	failure("Unable to run either %s --version or %s -W version",
	    testprog, testprog);
	if (!assert(r == 0))
		return;

	/* --version should generate nothing to stderr. */
	assertEmptyFile("version.stderr");
	/* Verify format of version message. */
	p = slurpfile(&s, "version.stdout");
	verify(p, s);
	free(p);
}